

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

JavascriptString *
Js::JavascriptString::NewWithBufferT<Js::LiteralString,true>
          (char16 *content,charcount_t cchUseLength,ScriptContext *scriptContext)

{
  Recycler *recycler;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptString *pJVar4;
  StaticType *type;
  char16 *content_00;
  
  if (content == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x49,"(content != nullptr)",
                                "NULL value passed to JavascriptString::New");
    if (!bVar2) goto LAB_00bc468b;
    *puVar3 = 0;
  }
  if (0x7ffffffe < cchUseLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x4a,"(IsValidCharCount(cchUseLength))",
                                "String length will overflow an int");
    if (!bVar2) {
LAB_00bc468b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (cchUseLength == 1) {
    pJVar4 = CharStringCache::GetStringForChar
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                         charStringCache,*content);
    return pJVar4;
  }
  if (cchUseLength == 0) {
    pJVar4 = JavascriptLibrary::GetEmptyString
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    return pJVar4;
  }
  recycler = scriptContext->recycler;
  type = StringCache::GetStringTypeStatic
                   (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  content_00 = AllocateLeafAndCopySz(recycler,content,cchUseLength);
  pJVar4 = &LiteralString::New(type,content_00,cchUseLength,recycler)->super_JavascriptString;
  return pJVar4;
}

Assistant:

JavascriptString* JavascriptString::NewWithBufferT(const char16 * content, charcount_t cchUseLength, ScriptContext * scriptContext)
    {
        AssertMsg(content != nullptr, "NULL value passed to JavascriptString::New");
        AssertMsg(IsValidCharCount(cchUseLength), "String length will overflow an int");
        switch (cchUseLength)
        {
        case 0:
            return scriptContext->GetLibrary()->GetEmptyString();

        case 1:
            return scriptContext->GetLibrary()->GetCharStringCache().GetStringForChar(*content);

        default:
            break;
        }

        Recycler* recycler = scriptContext->GetRecycler();
        StaticType * stringTypeStatic = scriptContext->GetLibrary()->GetStringTypeStatic();
        char16 const * buffer = content;

        charcount_t cchUseBoundLength = static_cast<charcount_t>(cchUseLength);
        if (copyBuffer)
        {
             buffer = JavascriptString::AllocateLeafAndCopySz(recycler, content, cchUseBoundLength);
        }

        return T::New(stringTypeStatic, buffer, cchUseBoundLength, recycler);
    }